

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O3

void __thiscall
TPZFileEqnStorage<std::complex<float>_>::Forward
          (TPZFileEqnStorage<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *f,
          DecomposeType dec)

{
  long __off;
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  int64_t position;
  TPZEqnArray<std::complex<float>_> REqnArray;
  long local_32c8;
  TPZEqnArray<std::complex<float>_> local_32c0;
  
  TPZEqnArray<std::complex<float>_>::TPZEqnArray(&local_32c0);
  lVar5 = (this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
  if (0 < lVar5) {
    lVar6 = 0;
    do {
      __off = (this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[lVar6];
      if (__off != 0) {
        iVar1 = fseek((FILE *)this->fIOStream,__off,0);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"fseek fail on Element ",0x16);
          poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," Position ",10);
          poVar2 = std::ostream::_M_insert<long>((long)poVar2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          std::ostream::flush();
        }
        sVar3 = fread(&local_32c8,8,1,(FILE *)this->fIOStream);
        lVar5 = local_32c8;
        if (sVar3 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"fread fail on Element ",0x16);
          poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," Position ",10);
          lVar5 = local_32c8;
          poVar2 = std::ostream::_M_insert<long>((long)poVar2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EOF ",4);
          iVar1 = feof((FILE *)this->fIOStream);
          plVar4 = (long *)std::ostream::operator<<(&std::cout,iVar1);
          std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
          std::ostream::put((char)plVar4);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Error Number ",0xd);
          iVar1 = ferror((FILE *)this->fIOStream);
          plVar4 = (long *)std::ostream::operator<<(&std::cout,iVar1);
          std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
          std::ostream::put((char)plVar4);
          std::ostream::flush();
          std::ostream::flush();
        }
        iVar1 = fseek((FILE *)this->fIOStream,lVar5,0);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"fseek fail on Element ",0x16);
          poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," Position ",10);
          poVar2 = std::ostream::_M_insert<long>((long)poVar2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          std::ostream::flush();
        }
        TPZEqnArray<std::complex<float>_>::Read(&local_32c0,this->fIOStream);
        TPZEqnArray<std::complex<float>_>::EqnForward(&local_32c0,f,dec);
        lVar5 = (this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < lVar5);
  }
  TPZEqnArray<std::complex<float>_>::~TPZEqnArray(&local_32c0);
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::Forward(TPZFMatrix<TVar> &f, DecomposeType dec) const
{
	TPZEqnArray<TVar> REqnArray;
	for(int64_t i=0;i<fBlockPos.NElements();i++) {
		if (fBlockPos[i]) {
			if(fseek(fIOStream,fBlockPos[i],SEEK_SET)){
				cout << "fseek fail on Element " << i << " Position " << fBlockPos[i] << endl;
				cout.flush();
			}
			int64_t position;
			if(!fread(&position,sizeof(int64_t),1,fIOStream)){
				cout << "fread fail on Element " << i << " Position " << position << endl;
				cout << "EOF " << feof(fIOStream) << endl;
				cout << "Error Number " << ferror(fIOStream) << endl;
				cout.flush();
			}
			if(fseek(fIOStream,position,SEEK_SET)){
				cout << "fseek fail on Element " << i << " Position " << position << endl;
				cout.flush();
			}
			
			REqnArray.Read(fIOStream);
			REqnArray.EqnForward(f,dec);
		}
	}
}